

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

size_t __thiscall std::hash<wasm::Field>::operator()(hash<wasm::Field> *this,Field *field)

{
  size_t local_20;
  size_t digest;
  Field *field_local;
  hash<wasm::Field> *this_local;
  
  digest = (size_t)field;
  field_local = (Field *)this;
  local_20 = ::wasm::hash<wasm::Type>(&field->type);
  ::wasm::rehash<wasm::Field::PackedType>(&local_20,(PackedType *)(digest + 8));
  ::wasm::rehash<wasm::Mutability>(&local_20,(Mutability *)(digest + 0xc));
  return local_20;
}

Assistant:

size_t hash<wasm::Field>::operator()(const wasm::Field& field) const {
  auto digest = wasm::hash(field.type);
  wasm::rehash(digest, field.packedType);
  wasm::rehash(digest, field.mutable_);
  return digest;
}